

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

ostream * node::operator<<(ostream *os,BlockfileType *type)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*type == ASSUMED) {
    pcVar2 = "assumed";
  }
  else {
    if (*type != NORMAL) {
      std::ios::setstate((int)os->_vptr_basic_ostream[-3] + (int)os);
      goto LAB_0075fd97;
    }
    pcVar2 = "normal";
  }
  std::operator<<(os,pcVar2);
LAB_0075fd97:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileType& type) {
    switch(type) {
        case BlockfileType::NORMAL: os << "normal"; break;
        case BlockfileType::ASSUMED: os << "assumed"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}